

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pager_unlock(Pager *pPager)

{
  Pager *in_RDI;
  int iDc;
  int rc;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  uint in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  undefined4 uVar1;
  
  sqlite3BitvecDestroy((Bitvec *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  in_RDI->pInJournal = (Bitvec *)0x0;
  releaseAllSavepoints((Pager *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if (in_RDI->pWal == (Wal *)0x0) {
    if (in_RDI->exclusiveMode == '\0') {
      uVar1 = 0xaaaaaaaa;
      if (in_RDI->fd->pMethods == (sqlite3_io_methods *)0x0) {
        in_stack_ffffffffffffffec = 0;
      }
      else {
        in_stack_ffffffffffffffec =
             sqlite3OsDeviceCharacteristics
                       ((sqlite3_file *)
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      }
      in_stack_fffffffffffffff0 = in_stack_ffffffffffffffec;
      if (((in_stack_ffffffffffffffec & 0x800) == 0) || ((in_RDI->journalMode & 5) != 1)) {
        sqlite3OsClose((sqlite3_file *)0x163109);
      }
      in_stack_fffffffffffffff4 =
           pagerUnlockDb((Pager *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
                         in_stack_ffffffffffffffec);
      if ((in_stack_fffffffffffffff4 != 0) && (in_RDI->eState == '\x06')) {
        in_RDI->eLock = '\x05';
      }
      in_RDI->eState = '\0';
    }
  }
  else {
    sqlite3WalEndReadTransaction((Wal *)0x16307e);
    in_RDI->eState = '\0';
  }
  if (in_RDI->errCode != 0) {
    if (in_RDI->tempFile == '\0') {
      pager_reset((Pager *)0x163169);
      in_RDI->changeCountDone = '\0';
      in_RDI->eState = '\0';
    }
    else {
      in_RDI->eState = in_RDI->jfd->pMethods == (sqlite3_io_methods *)0x0;
    }
    if (in_RDI->bUseFetch != '\0') {
      sqlite3OsUnfetch((sqlite3_file *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)
                       ,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                       (void *)0x1631c1);
    }
    in_RDI->errCode = 0;
    setGetterMethod(in_RDI);
  }
  in_RDI->journalOff = 0;
  in_RDI->journalHdr = 0;
  in_RDI->setSuper = '\0';
  return;
}

Assistant:

static void pager_unlock(Pager *pPager){

  assert( pPager->eState==PAGER_READER
       || pPager->eState==PAGER_OPEN
       || pPager->eState==PAGER_ERROR
  );

  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = 0;
  releaseAllSavepoints(pPager);

  if( pagerUseWal(pPager) ){
    assert( !isOpen(pPager->jfd) );
    sqlite3WalEndReadTransaction(pPager->pWal);
    pPager->eState = PAGER_OPEN;
  }else if( !pPager->exclusiveMode ){
    int rc;                       /* Error code returned by pagerUnlockDb() */
    int iDc = isOpen(pPager->fd)?sqlite3OsDeviceCharacteristics(pPager->fd):0;

    /* If the operating system support deletion of open files, then
    ** close the journal file when dropping the database lock.  Otherwise
    ** another connection with journal_mode=delete might delete the file
    ** out from under us.
    */
    assert( (PAGER_JOURNALMODE_MEMORY   & 5)!=1 );
    assert( (PAGER_JOURNALMODE_OFF      & 5)!=1 );
    assert( (PAGER_JOURNALMODE_WAL      & 5)!=1 );
    assert( (PAGER_JOURNALMODE_DELETE   & 5)!=1 );
    assert( (PAGER_JOURNALMODE_TRUNCATE & 5)==1 );
    assert( (PAGER_JOURNALMODE_PERSIST  & 5)==1 );
    if( 0==(iDc & SQLITE_IOCAP_UNDELETABLE_WHEN_OPEN)
     || 1!=(pPager->journalMode & 5)
    ){
      sqlite3OsClose(pPager->jfd);
    }

    /* If the pager is in the ERROR state and the call to unlock the database
    ** file fails, set the current lock to UNKNOWN_LOCK. See the comment
    ** above the #define for UNKNOWN_LOCK for an explanation of why this
    ** is necessary.
    */
    rc = pagerUnlockDb(pPager, NO_LOCK);
    if( rc!=SQLITE_OK && pPager->eState==PAGER_ERROR ){
      pPager->eLock = UNKNOWN_LOCK;
    }

    /* The pager state may be changed from PAGER_ERROR to PAGER_OPEN here
    ** without clearing the error code. This is intentional - the error
    ** code is cleared and the cache reset in the block below.
    */
    assert( pPager->errCode || pPager->eState!=PAGER_ERROR );
    pPager->eState = PAGER_OPEN;
  }

  /* If Pager.errCode is set, the contents of the pager cache cannot be
  ** trusted. Now that there are no outstanding references to the pager,
  ** it can safely move back to PAGER_OPEN state. This happens in both
  ** normal and exclusive-locking mode.
  */
  assert( pPager->errCode==SQLITE_OK || !MEMDB );
  if( pPager->errCode ){
    if( pPager->tempFile==0 ){
      pager_reset(pPager);
      pPager->changeCountDone = 0;
      pPager->eState = PAGER_OPEN;
    }else{
      pPager->eState = (isOpen(pPager->jfd) ? PAGER_OPEN : PAGER_READER);
    }
    if( USEFETCH(pPager) ) sqlite3OsUnfetch(pPager->fd, 0, 0);
    pPager->errCode = SQLITE_OK;
    setGetterMethod(pPager);
  }

  pPager->journalOff = 0;
  pPager->journalHdr = 0;
  pPager->setSuper = 0;
}